

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

bool __thiscall
Hpipe::Instruction::find_rec(Instruction *this,function<bool_(Hpipe::Instruction_*)> *f)

{
  Instruction *this_00;
  bool bVar1;
  function<bool_(Hpipe::Instruction_*)> local_60;
  reference local_40;
  Transition *t;
  iterator __end1;
  iterator __begin1;
  Vec<Hpipe::Transition> *__range1;
  function<bool_(Hpipe::Instruction_*)> *f_local;
  Instruction *this_local;
  
  if (this->op_id == cur_op_id) {
    this_local._7_1_ = false;
  }
  else {
    this->op_id = cur_op_id;
    bVar1 = std::function<bool_(Hpipe::Instruction_*)>::operator()(f,this);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      __end1 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::begin
                         (&(this->next).
                           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
      t = (Transition *)
          std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::end
                    (&(this->next).
                      super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                                         *)&t), bVar1) {
        local_40 = __gnu_cxx::
                   __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                   ::operator*(&__end1);
        this_00 = local_40->inst;
        std::function<bool_(Hpipe::Instruction_*)>::function(&local_60,f);
        bVar1 = find_rec(this_00,&local_60);
        std::function<bool_(Hpipe::Instruction_*)>::~function(&local_60);
        if (bVar1) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::find_rec( std::function<bool (Instruction *)> f ) {
    if ( op_id == Instruction::cur_op_id )
        return false;
    op_id = Instruction::cur_op_id;

    if ( f( this ) )
        return true;

    for( Transition &t : next )
        if ( t.inst->find_rec( f ) )
            return true;
    return false;
}